

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__read_subframe_header(ma_dr_flac_bs *bs,ma_dr_flac_subframe *pSubframe)

{
  bool bVar1;
  ma_bool32 mVar2;
  uint uVar3;
  ma_dr_flac_bs *in_RSI;
  long in_RDI;
  uint wastedBitsPerSample;
  int type;
  ma_uint8 header;
  ma_uint32 setBitOffsetPlus1;
  ma_uint32 zeroCounter;
  ma_uint64 r;
  ma_uint32 n;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  uint in_stack_ffffffffffffff8c;
  byte bVar4;
  ma_bool32 local_5c;
  int local_54;
  int local_2c;
  int local_14;
  ulong local_10;
  int local_4;
  
  mVar2 = ma_dr_flac__read_uint8
                    (in_RSI,in_stack_ffffffffffffff8c,
                     (ma_uint8 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if (mVar2 == 0) {
    local_5c = 0;
  }
  else {
    bVar4 = (byte)(in_stack_ffffffffffffff8c >> 0x18);
    if ((in_stack_ffffffffffffff8c & 0x80000000) == 0) {
      *(undefined1 *)((long)&in_RSI->onRead + 2) = 0;
      uVar3 = (int)(bVar4 & 0x7e) >> 1;
      if (uVar3 == 0) {
        *(undefined1 *)&in_RSI->onRead = 0;
      }
      else if (uVar3 == 1) {
        *(undefined1 *)&in_RSI->onRead = 1;
      }
      else if ((uVar3 & 0x20) == 0) {
        if ((uVar3 & 8) == 0) {
          *(undefined1 *)&in_RSI->onRead = 0xff;
        }
        else {
          *(undefined1 *)&in_RSI->onRead = 8;
          *(byte *)((long)&in_RSI->onRead + 2) = (byte)uVar3 & 7;
          if (4 < *(byte *)((long)&in_RSI->onRead + 2)) {
            *(undefined1 *)&in_RSI->onRead = 0xff;
            *(undefined1 *)((long)&in_RSI->onRead + 2) = 0;
          }
        }
      }
      else {
        *(undefined1 *)&in_RSI->onRead = 0x20;
        *(byte *)((long)&in_RSI->onRead + 2) = ((byte)uVar3 & 0x1f) + 1;
      }
      if (*(char *)&in_RSI->onRead == -1) {
        local_5c = 0;
      }
      else {
        *(undefined1 *)((long)&in_RSI->onRead + 1) = 0;
        if ((bVar4 & 1) == 1) {
          local_54 = 0;
          do {
            if (*(long *)(in_RDI + 0x1030) != 0) {
              if (*(long *)(in_RDI + 0x1030) == 1) {
                in_stack_ffffffffffffff84 = (local_54 - *(int *)(in_RDI + 0x2c)) + 0x3f;
                mVar2 = ma_dr_flac__reload_cache
                                  ((ma_dr_flac_bs *)
                                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
                if (mVar2 == 0) {
                  bVar1 = false;
                }
                else {
                  bVar1 = true;
                }
              }
              else {
                local_10 = *(ulong *)(in_RDI + 0x1030);
                if (ma_dr_flac__gIsLZCNTSupported == 0) {
                  if (local_10 == 0) {
                    local_4 = 0x40;
                  }
                  else {
                    local_14 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                       (local_10 >> 0x3c) * 4);
                    if (local_14 == 0) {
                      local_14 = 0;
                      if ((local_10 & 0xffffffff00000000) == 0) {
                        local_14 = 0x20;
                        local_10 = local_10 << 0x20;
                      }
                      if ((local_10 & 0xffff000000000000) == 0) {
                        local_14 = local_14 + 0x10;
                        local_10 = local_10 << 0x10;
                      }
                      if ((local_10 & 0xff00000000000000) == 0) {
                        local_14 = local_14 + 8;
                        local_10 = local_10 << 8;
                      }
                      if ((local_10 & 0xf000000000000000) == 0) {
                        local_14 = local_14 + 4;
                        local_10 = local_10 << 4;
                      }
                      local_14 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                         + (local_10 >> 0x3c) * 4) + local_14;
                    }
                    local_4 = local_14 + -1;
                  }
                  local_2c = local_4;
                }
                else {
                  local_2c = (int)LZCOUNT(local_10);
                }
                uVar3 = local_2c + 1;
                if (0x40 - (ulong)*(uint *)(in_RDI + 0x2c) < (ulong)uVar3) {
                  bVar1 = false;
                }
                else {
                  *(uint *)(in_RDI + 0x2c) = uVar3 + *(int *)(in_RDI + 0x2c);
                  *(long *)(in_RDI + 0x1030) = *(long *)(in_RDI + 0x1030) << ((byte)uVar3 & 0x3f);
                  in_stack_ffffffffffffff84 = local_54 + uVar3 + -1;
                  bVar1 = true;
                }
              }
              goto LAB_00277dc1;
            }
            local_54 = (0x40 - *(int *)(in_RDI + 0x2c)) + local_54;
            mVar2 = ma_dr_flac__reload_cache
                              ((ma_dr_flac_bs *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          } while (mVar2 != 0);
          bVar1 = false;
LAB_00277dc1:
          if (!bVar1) {
            return 0;
          }
          *(char *)((long)&in_RSI->onRead + 1) = (char)in_stack_ffffffffffffff84 + '\x01';
        }
        local_5c = 1;
      }
    }
    else {
      local_5c = 0;
    }
  }
  return local_5c;
}

Assistant:

static ma_bool32 ma_dr_flac__read_subframe_header(ma_dr_flac_bs* bs, ma_dr_flac_subframe* pSubframe)
{
    ma_uint8 header;
    int type;
    if (!ma_dr_flac__read_uint8(bs, 8, &header)) {
        return MA_FALSE;
    }
    if ((header & 0x80) != 0) {
        return MA_FALSE;
    }
    pSubframe->lpcOrder = 0;
    type = (header & 0x7E) >> 1;
    if (type == 0) {
        pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_CONSTANT;
    } else if (type == 1) {
        pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_VERBATIM;
    } else {
        if ((type & 0x20) != 0) {
            pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_LPC;
            pSubframe->lpcOrder = (ma_uint8)(type & 0x1F) + 1;
        } else if ((type & 0x08) != 0) {
            pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_FIXED;
            pSubframe->lpcOrder = (ma_uint8)(type & 0x07);
            if (pSubframe->lpcOrder > 4) {
                pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_RESERVED;
                pSubframe->lpcOrder = 0;
            }
        } else {
            pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_RESERVED;
        }
    }
    if (pSubframe->subframeType == MA_DR_FLAC_SUBFRAME_RESERVED) {
        return MA_FALSE;
    }
    pSubframe->wastedBitsPerSample = 0;
    if ((header & 0x01) == 1) {
        unsigned int wastedBitsPerSample;
        if (!ma_dr_flac__seek_past_next_set_bit(bs, &wastedBitsPerSample)) {
            return MA_FALSE;
        }
        pSubframe->wastedBitsPerSample = (ma_uint8)wastedBitsPerSample + 1;
    }
    return MA_TRUE;
}